

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

unsigned_long xmlDictComputeFastQKey(xmlChar *prefix,int plen,xmlChar *name,int len,int seed)

{
  uint uVar1;
  uint uVar2;
  unsigned_long uVar3;
  int iVar4;
  unsigned_long uVar5;
  
  if (plen == 0) {
    uVar5 = (long)seed + 0x6cc;
  }
  else {
    uVar5 = (long)seed + (ulong)*prefix * 0x20 + (ulong)*prefix * -2;
  }
  if (10 < len) {
    uVar2 = (len - plen) - 2;
    uVar1 = len - 0xb;
    if (-1 < (int)uVar2) {
      uVar1 = uVar2;
    }
    uVar5 = uVar5 + name[uVar1];
    len = 10;
    if (9 < plen) {
      plen = 10;
    }
  }
  switch(plen) {
  case 10:
    uVar5 = uVar5 + prefix[9];
  case 9:
    uVar5 = uVar5 + prefix[8];
  case 8:
    uVar5 = uVar5 + prefix[7];
  case 7:
    uVar5 = uVar5 + prefix[6];
  case 6:
    uVar5 = uVar5 + prefix[5];
  case 5:
    uVar5 = uVar5 + prefix[4];
  case 4:
    uVar5 = uVar5 + prefix[3];
  case 3:
    uVar5 = uVar5 + prefix[2];
  case 2:
    uVar5 = uVar5 + prefix[1];
  case 1:
    uVar5 = uVar5 + *prefix;
  default:
    iVar4 = len - plen;
    uVar3 = uVar5 + 0x3a;
    if (iVar4 < 1) {
      uVar3 = uVar5;
    }
  }
  switch(~(uint)(0 < iVar4) + iVar4) {
  case 9:
    uVar3 = uVar3 + name[9];
  case 8:
    uVar3 = uVar3 + name[8];
  case 7:
    uVar3 = uVar3 + name[7];
  case 6:
    uVar3 = uVar3 + name[6];
  case 5:
    uVar3 = uVar3 + name[5];
  case 4:
    uVar3 = uVar3 + name[4];
  case 3:
    uVar3 = uVar3 + name[3];
  case 2:
    uVar3 = uVar3 + name[2];
  case 1:
    uVar3 = uVar3 + name[1];
  case 0:
    return uVar3 + *name;
  default:
    return uVar3;
  }
}

Assistant:

static unsigned long
xmlDictComputeFastQKey(const xmlChar *prefix, int plen,
                       const xmlChar *name, int len, int seed)
{
    unsigned long value = (unsigned long) seed;

    if (plen == 0)
	value += 30 * (unsigned long) ':';
    else
	value += 30 * (*prefix);

    if (len > 10) {
        int offset = len - (plen + 1 + 1);
	if (offset < 0)
	    offset = len - (10 + 1);
	value += name[offset];
        len = 10;
	if (plen > 10)
	    plen = 10;
    }
    switch (plen) {
        case 10: value += prefix[9];
        /* Falls through. */
        case 9: value += prefix[8];
        /* Falls through. */
        case 8: value += prefix[7];
        /* Falls through. */
        case 7: value += prefix[6];
        /* Falls through. */
        case 6: value += prefix[5];
        /* Falls through. */
        case 5: value += prefix[4];
        /* Falls through. */
        case 4: value += prefix[3];
        /* Falls through. */
        case 3: value += prefix[2];
        /* Falls through. */
        case 2: value += prefix[1];
        /* Falls through. */
        case 1: value += prefix[0];
        /* Falls through. */
        default: break;
    }
    len -= plen;
    if (len > 0) {
        value += (unsigned long) ':';
	len--;
    }
    switch (len) {
        case 10: value += name[9];
        /* Falls through. */
        case 9: value += name[8];
        /* Falls through. */
        case 8: value += name[7];
        /* Falls through. */
        case 7: value += name[6];
        /* Falls through. */
        case 6: value += name[5];
        /* Falls through. */
        case 5: value += name[4];
        /* Falls through. */
        case 4: value += name[3];
        /* Falls through. */
        case 3: value += name[2];
        /* Falls through. */
        case 2: value += name[1];
        /* Falls through. */
        case 1: value += name[0];
        /* Falls through. */
        default: break;
    }
    return(value);
}